

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cpp
# Opt level: O2

int __thiscall libDAI::MF::init(MF *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  TProb<double> *pTVar2;
  Exception *this_00;
  pointer pTVar3;
  allocator<char> local_39;
  string local_38;
  
  uVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  pTVar2 = (TProb<double> *)(ulong)uVar1;
  if ((char)uVar1 != '\0') {
    for (pTVar3 = (this->_beliefs).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar3 != (this->_beliefs).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
      pTVar2 = TProb<double>::fill(&pTVar3->_p,1.0);
    }
    return (int)pTVar2;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"mf.cpp, line 85",&local_39);
  Exception::Exception(this_00,8,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MF::init() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for( vector<Factor>::iterator qi = _beliefs.begin(); qi != _beliefs.end(); qi++ )
            qi->fill(1.0);
    }